

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cdef_block_simd.h
# Opt level: O0

int cdef_find_dir_sse4_1(uint16_t *img,int stride,int32_t *var,int coeff_shift)

{
  undefined1 auVar1 [12];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined8 uVar5;
  undefined8 uVar6;
  int iVar7;
  uint in_ECX;
  int *in_RDX;
  int in_ESI;
  long in_RDI;
  uint uVar8;
  uint uVar9;
  undefined8 extraout_XMM0_Qa;
  undefined8 extraout_XMM0_Qa_00;
  uint uVar14;
  undefined1 in_XMM0 [16];
  undefined1 auVar10 [16];
  uint uVar12;
  uint uVar13;
  undefined8 extraout_XMM0_Qb;
  undefined8 extraout_XMM0_Qb_00;
  uint uVar15;
  undefined1 auVar11 [16];
  v128 t;
  v128 max;
  v128 dir03;
  v128 dir47;
  v128 lines [8];
  int best_dir;
  int32_t best_cost;
  int32_t cost [8];
  int i;
  undefined8 local_418;
  undefined8 uStackY_410;
  undefined8 local_3d8 [5];
  v128 *in_stack_fffffffffffffc50;
  v128 *in_stack_fffffffffffffc58;
  int local_348 [10];
  int local_320;
  int *local_318;
  undefined1 (*local_300) [16];
  undefined8 local_2f8;
  undefined8 uStack_2f0;
  undefined1 local_2e8 [16];
  undefined8 local_2c8;
  undefined8 uStack_2c0;
  undefined2 local_2aa;
  undefined1 local_2a8 [16];
  undefined1 local_298 [16];
  undefined1 local_288 [16];
  undefined1 local_278 [16];
  undefined8 local_248;
  undefined8 uStack_240;
  int local_238;
  int iStack_234;
  int iStack_230;
  int iStack_22c;
  int local_228;
  int iStack_224;
  int iStack_220;
  int iStack_21c;
  undefined8 local_208;
  undefined8 uStack_200;
  undefined8 local_1e8;
  undefined8 uStack_1e0;
  undefined1 local_1d8 [16];
  undefined8 local_1c8;
  undefined8 uStack_1c0;
  undefined8 local_1b8;
  undefined8 uStack_1b0;
  undefined1 (*local_1a0) [16];
  undefined8 local_198;
  undefined8 uStack_190;
  undefined8 local_188;
  undefined8 uStack_180;
  ulong local_178;
  undefined8 uStack_170;
  undefined8 local_168;
  undefined8 uStack_160;
  undefined1 local_158 [16];
  undefined2 local_13a;
  undefined8 local_138;
  undefined8 uStack_130;
  undefined2 local_128;
  undefined2 local_126;
  undefined2 local_124;
  undefined2 local_122;
  undefined2 local_120;
  undefined2 local_11e;
  undefined2 local_11c;
  undefined2 local_11a;
  uint local_118;
  uint uStack_114;
  uint uStack_110;
  uint uStack_10c;
  uint local_108;
  uint uStack_104;
  uint uStack_100;
  uint uStack_fc;
  undefined8 local_f8;
  undefined8 uStack_f0;
  undefined8 local_e8;
  undefined8 uStack_e0;
  undefined8 local_d8;
  undefined8 uStack_d0;
  undefined8 local_c8;
  undefined8 uStack_c0;
  undefined8 local_b8;
  undefined8 uStack_b0;
  undefined8 local_a8;
  undefined8 uStack_a0;
  undefined8 local_98;
  undefined8 uStack_90;
  undefined8 local_88;
  undefined8 uStack_80;
  undefined8 local_68;
  undefined8 uStack_60;
  undefined8 local_48;
  undefined8 uStack_40;
  undefined8 local_38;
  undefined8 uStack_30;
  undefined8 local_28;
  undefined8 uStack_20;
  undefined8 local_18;
  undefined8 uStack_10;
  
  for (local_320 = 0; local_320 < 8; local_320 = local_320 + 1) {
    local_300 = (undefined1 (*) [16])(in_RDI + (long)(local_320 * in_ESI) * 2);
    local_1a0 = local_300;
    auVar10 = lddqu(in_XMM0,*local_300);
    *(undefined1 (*) [16])(local_3d8 + (long)local_320 * 2) = auVar10;
    local_2c8 = local_3d8[(long)local_320 * 2];
    uStack_2c0 = local_3d8[(long)local_320 * 2 + 1];
    local_158 = ZEXT416(in_ECX);
    auVar4 = local_158;
    local_158._4_4_ = 0;
    local_158._0_4_ = in_ECX;
    local_168 = local_2c8;
    uStack_160 = uStack_2c0;
    local_178 = local_158._0_8_;
    uStack_170 = 0;
    auVar3._8_8_ = uStack_2c0;
    auVar3._0_8_ = local_2c8;
    auVar2._8_8_ = 0;
    auVar2._0_8_ = local_158._0_8_;
    local_2e8 = psraw(auVar3,auVar2);
    local_2aa = 0x80;
    local_13a = 0x80;
    local_11a = 0x80;
    local_11c = 0x80;
    local_11e = 0x80;
    local_120 = 0x80;
    local_122 = 0x80;
    local_124 = 0x80;
    local_126 = 0x80;
    local_128 = 0x80;
    local_138 = 0x80008000800080;
    uStack_130 = 0x80008000800080;
    auVar10 = local_2e8;
    local_2f8 = 0x80008000800080;
    uStack_2f0 = 0x80008000800080;
    local_188 = local_2e8._0_8_;
    uVar5 = local_188;
    uStack_180 = local_2e8._8_8_;
    uVar6 = uStack_180;
    local_198 = 0x80008000800080;
    uStack_190 = 0x80008000800080;
    local_188._0_2_ = local_2e8._0_2_;
    local_188._2_2_ = local_2e8._2_2_;
    local_188._4_2_ = local_2e8._4_2_;
    local_188._6_2_ = local_2e8._6_2_;
    uStack_180._0_2_ = local_2e8._8_2_;
    uStack_180._2_2_ = local_2e8._10_2_;
    uStack_180._4_2_ = local_2e8._12_2_;
    uStack_180._6_2_ = local_2e8._14_2_;
    in_XMM0._0_2_ = (short)local_188 + -0x80;
    in_XMM0._2_2_ = local_188._2_2_ + -0x80;
    in_XMM0._4_2_ = local_188._4_2_ + -0x80;
    in_XMM0._6_2_ = local_188._6_2_ + -0x80;
    in_XMM0._8_2_ = (short)uStack_180 + -0x80;
    in_XMM0._10_2_ = uStack_180._2_2_ + -0x80;
    in_XMM0._12_2_ = uStack_180._4_2_ + -0x80;
    in_XMM0._14_2_ = uStack_180._6_2_ + -0x80;
    *(undefined1 (*) [16])(local_3d8 + (long)local_320 * 2) = in_XMM0;
    local_2e8 = auVar10;
    local_188 = uVar5;
    uStack_180 = uVar6;
    local_158 = auVar4;
  }
  local_318 = in_RDX;
  compute_directions(in_stack_fffffffffffffc58,(int32_t *)in_stack_fffffffffffffc50);
  array_reverse_transpose_8x8(in_stack_fffffffffffffc58,in_stack_fffffffffffffc50);
  compute_directions(in_stack_fffffffffffffc58,(int32_t *)in_stack_fffffffffffffc50);
  local_108 = (uint)extraout_XMM0_Qa_00;
  uStack_104 = (uint)((ulong)extraout_XMM0_Qa_00 >> 0x20);
  uStack_100 = (uint)extraout_XMM0_Qb_00;
  uStack_fc = (uint)((ulong)extraout_XMM0_Qb_00 >> 0x20);
  local_118 = (uint)extraout_XMM0_Qa;
  uStack_114 = (uint)((ulong)extraout_XMM0_Qa >> 0x20);
  uStack_110 = (uint)extraout_XMM0_Qb;
  uStack_10c = (uint)((ulong)extraout_XMM0_Qb >> 0x20);
  uVar8 = ((int)local_108 < (int)local_118) * local_118 |
          ((int)local_108 >= (int)local_118) * local_108;
  uVar12 = ((int)uStack_104 < (int)uStack_114) * uStack_114 |
           ((int)uStack_104 >= (int)uStack_114) * uStack_104;
  uVar14 = ((int)uStack_100 < (int)uStack_110) * uStack_110 |
           ((int)uStack_100 >= (int)uStack_110) * uStack_100;
  uVar15 = ((int)uStack_fc < (int)uStack_10c) * uStack_10c |
           ((int)uStack_fc >= (int)uStack_10c) * uStack_fc;
  local_e8 = CONCAT44(uVar12,uVar8);
  local_278._8_4_ = uVar14;
  local_278._0_8_ = local_e8;
  local_278._12_4_ = uVar15;
  local_288._0_8_ = local_278._8_8_;
  local_288._8_4_ = uVar8;
  local_288._12_4_ = uVar12;
  uStack_f0 = local_288._8_8_;
  uVar9 = ((int)uVar8 < (int)uVar14) * uVar14 | ((int)uVar8 >= (int)uVar14) * uVar8;
  uVar13 = ((int)uVar12 < (int)uVar15) * uVar15 | ((int)uVar12 >= (int)uVar15) * uVar12;
  uVar14 = ((int)uVar14 < (int)uVar8) * uVar8 | ((int)uVar14 >= (int)uVar8) * uVar14;
  uVar15 = ((int)uVar15 < (int)uVar12) * uVar12 | ((int)uVar15 >= (int)uVar12) * uVar15;
  local_c8 = CONCAT44(uVar13,uVar9);
  auVar1._8_4_ = uVar14;
  auVar1._0_8_ = local_c8;
  local_298._12_4_ = uVar15;
  local_298._0_12_ = auVar1;
  auVar11._0_12_ = local_298._4_12_;
  auVar11._12_4_ = uVar9;
  local_2a8._0_8_ = auVar1._4_8_;
  local_2a8._8_8_ = auVar11._8_8_;
  uStack_c0 = local_298._8_8_;
  local_d8 = local_2a8._0_8_;
  uStack_d0 = local_2a8._8_8_;
  uVar12 = ((int)uVar9 < (int)uVar13) * uVar13 | ((int)uVar9 >= (int)uVar13) * uVar9;
  uVar8 = ((int)uVar13 < (int)uVar14) * uVar14 | ((int)uVar13 >= (int)uVar14) * uVar13;
  uVar13 = ((int)uVar14 < (int)uVar15) * uVar15 | ((int)uVar14 >= (int)uVar15) * uVar14;
  uVar9 = ((int)uVar15 < (int)uVar9) * uVar9 | ((int)uVar15 >= (int)uVar9) * uVar15;
  local_248 = CONCAT44(uVar8,uVar12);
  uStack_240 = CONCAT44(uVar9,uVar13);
  local_1e8 = CONCAT44(uVar8,uVar12);
  uStack_1e0 = CONCAT44(uVar9,uVar13);
  local_228 = -(uint)(uVar12 == local_118);
  iStack_224 = -(uint)(uVar8 == uStack_114);
  iStack_220 = -(uint)(uVar13 == uStack_110);
  iStack_21c = -(uint)(uVar9 == uStack_10c);
  local_208 = CONCAT44(uVar8,uVar12);
  uStack_200 = CONCAT44(uVar9,uVar13);
  local_238 = -(uint)(uVar12 == local_108);
  iStack_234 = -(uint)(uVar8 == uStack_104);
  iStack_230 = -(uint)(uVar13 == uStack_100);
  iStack_22c = -(uint)(uVar9 == uStack_fc);
  local_88 = CONCAT44(iStack_234,local_238);
  uStack_80 = CONCAT44(iStack_22c,iStack_230);
  local_98 = CONCAT44(iStack_224,local_228);
  uStack_90 = CONCAT44(iStack_21c,iStack_220);
  auVar4._8_8_ = uStack_80;
  auVar4._0_8_ = local_88;
  auVar10._8_8_ = uStack_90;
  auVar10._0_8_ = local_98;
  auVar10 = packssdw(auVar4,auVar10);
  local_418 = auVar10._0_8_;
  uStackY_410 = auVar10._8_8_;
  local_1b8 = local_418;
  uStack_1b0 = uStackY_410;
  local_1c8 = local_418;
  uStack_1c0 = uStackY_410;
  local_18 = local_418;
  uStack_10 = uStackY_410;
  local_28 = local_418;
  uStack_20 = uStackY_410;
  local_1d8 = packsswb(auVar10,auVar10);
  local_38 = local_1d8._0_8_;
  uStack_30 = local_1d8._8_8_;
  uVar8 = (uint)(ushort)((ushort)(SUB161(local_1d8 >> 7,0) & 1) |
                         (ushort)(SUB161(local_1d8 >> 0xf,0) & 1) << 1 |
                         (ushort)(SUB161(local_1d8 >> 0x17,0) & 1) << 2 |
                         (ushort)(SUB161(local_1d8 >> 0x1f,0) & 1) << 3 |
                         (ushort)(SUB161(local_1d8 >> 0x27,0) & 1) << 4 |
                         (ushort)(SUB161(local_1d8 >> 0x2f,0) & 1) << 5 |
                         (ushort)(SUB161(local_1d8 >> 0x37,0) & 1) << 6 |
                         (ushort)(SUB161(local_1d8 >> 0x3f,0) & 1) << 7 |
                         (ushort)(SUB161(local_1d8 >> 0x47,0) & 1) << 8 |
                         (ushort)(SUB161(local_1d8 >> 0x4f,0) & 1) << 9 |
                         (ushort)(SUB161(local_1d8 >> 0x57,0) & 1) << 10 |
                         (ushort)(SUB161(local_1d8 >> 0x5f,0) & 1) << 0xb |
                         (ushort)(SUB161(local_1d8 >> 0x67,0) & 1) << 0xc |
                         (ushort)(SUB161(local_1d8 >> 0x6f,0) & 1) << 0xd |
                         (ushort)(SUB161(local_1d8 >> 0x77,0) & 1) << 0xe |
                        (ushort)(byte)(local_1d8[0xf] >> 7) << 0xf);
  local_2a8 = auVar11;
  local_f8 = local_288._0_8_;
  uStack_e0 = local_288._0_8_;
  local_b8 = local_248;
  uStack_b0 = uStack_240;
  local_a8 = local_248;
  uStack_a0 = uStack_240;
  local_68 = local_1e8;
  uStack_60 = uStack_1e0;
  local_48 = local_208;
  uStack_40 = uStack_200;
  iVar7 = get_msb(uVar8 ^ uVar8 - 1);
  *local_318 = uVar12 - local_348[(int)(iVar7 + 4U & 7)];
  *local_318 = *local_318 >> 10;
  return iVar7;
}

Assistant:

int SIMD_FUNC(cdef_find_dir)(const uint16_t *img, int stride, int32_t *var,
                             int coeff_shift) {
  int i;
  int32_t cost[8];
  int32_t best_cost = 0;
  int best_dir = 0;
  v128 lines[8];
  for (i = 0; i < 8; i++) {
    lines[i] = v128_load_unaligned(&img[i * stride]);
    lines[i] =
        v128_sub_16(v128_shr_s16(lines[i], coeff_shift), v128_dup_16(128));
  }

  /* Compute "mostly vertical" directions. */
  v128 dir47 = compute_directions(lines, cost + 4);

  array_reverse_transpose_8x8(lines, lines);

  /* Compute "mostly horizontal" directions. */
  v128 dir03 = compute_directions(lines, cost);

  v128 max = v128_max_s32(dir03, dir47);
  max = v128_max_s32(max, v128_align(max, max, 8));
  max = v128_max_s32(max, v128_align(max, max, 4));
  best_cost = v128_low_u32(max);
  v128 t =
      v128_pack_s32_s16(v128_cmpeq_32(max, dir47), v128_cmpeq_32(max, dir03));
  best_dir = v128_movemask_8(v128_pack_s16_s8(t, t));
  best_dir = get_msb(best_dir ^ (best_dir - 1));  // Count trailing zeros

  /* Difference between the optimal variance and the variance along the
     orthogonal direction. Again, the sum(x^2) terms cancel out. */
  *var = best_cost - cost[(best_dir + 4) & 7];
  /* We'd normally divide by 840, but dividing by 1024 is close enough
     for what we're going to do with this. */
  *var >>= 10;
  return best_dir;
}